

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMove0<(moira::Instr)71,(moira::Mode)0,(moira::Size)2>(Moira *this,u16 opcode)

{
  uint uVar1;
  uint uVar2;
  u32 uVar3;
  
  uVar1 = *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  uVar2 = uVar1 & 0xffff;
  (this->reg).sr.n = 0x7fff < uVar2;
  (this->reg).sr.z = uVar2 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  *(short *)((long)this->exec + (ulong)(opcode >> 9 & 7) * 4 + -0x58) = (short)uVar1;
  uVar3 = (this->reg).pc;
  (this->reg).pc0 = uVar3;
  (this->queue).ird = (this->queue).irc;
  uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
  (this->queue).irc = (u16)uVar3;
  return;
}

Assistant:

void
Moira::execMove0(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M, S, STD_AE_FRAME> (src, ea, data)) return;

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;

    if (!writeOp <MODE_DN, S> (dst, data)) return;

    prefetch<POLLIPL>();
}